

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

bool __thiscall RenX::Server::fetchClientList(Server *this)

{
  TCPSocket *pTVar1;
  uint uVar2;
  int iVar3;
  rep rVar4;
  char *pcVar5;
  
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar4;
  uVar2 = this->m_rconVersion;
  rVar4 = std::chrono::_V2::steady_clock::now();
  pTVar1 = &this->m_sock;
  (this->m_lastSendActivity).__d.__r = rVar4;
  if (uVar2 < 4) {
    iVar3 = Jupiter::Socket::send(pTVar1,0x5a,anon_var_dwarf_6a1fc);
    if (iVar3 < 1) {
      return false;
    }
    pcVar5 = anon_var_dwarf_6a213;
  }
  else {
    iVar3 = Jupiter::Socket::send
                      (pTVar1,0x5f,
                       "cclientvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PING ADMIN STEAM IP HWID PLAYERLOG\n"
                      );
    if (iVar3 < 1) {
      return false;
    }
    pcVar5 = "cbotvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PLAYERLOG\n";
  }
  rVar4 = std::chrono::_V2::steady_clock::now();
  (this->m_lastSendActivity).__d.__r = rVar4;
  iVar3 = Jupiter::Socket::send(pTVar1,0x43,pcVar5);
  return 0 < iVar3;
}

Assistant:

bool RenX::Server::fetchClientList() {
	m_lastClientListUpdate = std::chrono::steady_clock::now();
	// TODO: remove all support for rconVersion < 4
	if (m_rconVersion >= 4) {
		return sendSocket("cclientvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PING ADMIN STEAM IP HWID PLAYERLOG\n"sv) > 0
			&& sendSocket("cbotvarlist KILLS DEATHS SCORE CREDITS CHARACTER VEHICLE PLAYERLOG\n"sv) > 0;
	}

	return sendSocket("cclientvarlist KILLS\xA0""DEATHS\xA0""SCORE\xA0""CREDITS\xA0""CHARACTER\xA0""VEHICLE\xA0""PING\xA0""ADMIN\xA0""STEAM\xA0""IP\xA0""PLAYERLOG\n"sv) > 0
		&& sendSocket("cbotvarlist KILLS\xA0""DEATHS\xA0""SCORE\xA0""CREDITS\xA0""CHARACTER\xA0""VEHICLE\xA0""PLAYERLOG\n"sv) > 0;
}